

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWmonitor **ppGVar2;
  GLFWwindow *pGVar3;
  char *pcVar4;
  char *pcVar5;
  GLFWmonitor *local_50;
  GLFWmonitor *monitor;
  GLFWmonitor **monitors;
  undefined8 *puStack_38;
  int monitor_count;
  GLFWwindow **windows;
  int local_28;
  int all_monitors;
  int fullscreen;
  int window_count;
  int i;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_28 = 0;
  windows._4_4_ = 0;
  _i = argv;
  argv_local._0_4_ = argc;
  while (window_count = getopt((int)argv_local,_i,"afhn"), window_count != -1) {
    if (window_count == 0x61) {
      windows._4_4_ = 1;
    }
    else {
      if (window_count != 0x66) {
        if (window_count == 0x68) {
          usage();
          exit(0);
        }
        usage();
        exit(1);
      }
      local_28 = 1;
    }
  }
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  if ((local_28 == 0) || (windows._4_4_ == 0)) {
    local_50 = (GLFWmonitor *)0x0;
    if (local_28 != 0) {
      local_50 = glfwGetPrimaryMonitor();
    }
    all_monitors = 1;
    puStack_38 = (undefined8 *)calloc(1,8);
    pGVar3 = create_window(local_50);
    *puStack_38 = pGVar3;
  }
  else {
    ppGVar2 = glfwGetMonitors((int *)((long)&monitors + 4));
    all_monitors = monitors._4_4_;
    puStack_38 = (undefined8 *)calloc((long)monitors._4_4_,8);
    for (fullscreen = 0; fullscreen < monitors._4_4_; fullscreen = fullscreen + 1) {
      pGVar3 = create_window(ppGVar2[fullscreen]);
      puStack_38[fullscreen] = pGVar3;
      if (puStack_38[fullscreen] == 0) break;
    }
  }
  for (fullscreen = 0; fullscreen < all_monitors; fullscreen = fullscreen + 1) {
    glfwSetKeyCallback((GLFWwindow *)puStack_38[fullscreen],key_callback);
    glfwSetFramebufferSizeCallback((GLFWwindow *)puStack_38[fullscreen],framebuffer_size_callback);
    glfwSetWindowSizeCallback((GLFWwindow *)puStack_38[fullscreen],window_size_callback);
    glfwSetWindowFocusCallback((GLFWwindow *)puStack_38[fullscreen],window_focus_callback);
    glfwSetWindowIconifyCallback((GLFWwindow *)puStack_38[fullscreen],window_iconify_callback);
    glfwSetWindowMaximizeCallback((GLFWwindow *)puStack_38[fullscreen],window_maximize_callback);
    glfwSetWindowRefreshCallback((GLFWwindow *)puStack_38[fullscreen],window_refresh_callback);
    window_refresh_callback((GLFWwindow *)puStack_38[fullscreen]);
    iVar1 = glfwGetWindowAttrib((GLFWwindow *)puStack_38[fullscreen],0x20002);
    pcVar4 = "restored";
    if (iVar1 != 0) {
      pcVar4 = "iconified";
    }
    iVar1 = glfwGetWindowAttrib((GLFWwindow *)puStack_38[fullscreen],0x20001);
    pcVar5 = "defocused";
    if (iVar1 != 0) {
      pcVar5 = "focused";
    }
    printf("Window is %s and %s\n",pcVar4,pcVar5);
  }
  while( true ) {
    glfwWaitEvents();
    fullscreen = 0;
    while ((fullscreen < all_monitors &&
           (iVar1 = glfwWindowShouldClose((GLFWwindow *)puStack_38[fullscreen]), iVar1 == 0))) {
      fullscreen = fullscreen + 1;
    }
    if (fullscreen < all_monitors) break;
    fflush(_stdout);
  }
  glfwTerminate();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, window_count;
    int fullscreen = GLFW_FALSE, all_monitors = GLFW_FALSE;
    GLFWwindow** windows;

    while ((ch = getopt(argc, argv, "afhn")) != -1)
    {
        switch (ch)
        {
            case 'a':
                all_monitors = GLFW_TRUE;
                break;

            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GLFW_TRUE;
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (fullscreen && all_monitors)
    {
        int monitor_count;
        GLFWmonitor** monitors = glfwGetMonitors(&monitor_count);

        window_count = monitor_count;
        windows = calloc(window_count, sizeof(GLFWwindow*));

        for (i = 0;  i < monitor_count;  i++)
        {
            windows[i] = create_window(monitors[i]);
            if (!windows[i])
                break;
        }
    }
    else
    {
        GLFWmonitor* monitor = NULL;

        if (fullscreen)
            monitor = glfwGetPrimaryMonitor();

        window_count = 1;
        windows = calloc(window_count, sizeof(GLFWwindow*));
        windows[0] = create_window(monitor);
    }

    for (i = 0;  i < window_count;  i++)
    {
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetWindowSizeCallback(windows[i], window_size_callback);
        glfwSetWindowFocusCallback(windows[i], window_focus_callback);
        glfwSetWindowIconifyCallback(windows[i], window_iconify_callback);
        glfwSetWindowMaximizeCallback(windows[i], window_maximize_callback);
        glfwSetWindowRefreshCallback(windows[i], window_refresh_callback);

        window_refresh_callback(windows[i]);

        printf("Window is %s and %s\n",
            glfwGetWindowAttrib(windows[i], GLFW_ICONIFIED) ? "iconified" : "restored",
            glfwGetWindowAttrib(windows[i], GLFW_FOCUSED) ? "focused" : "defocused");
    }

    for (;;)
    {
        glfwWaitEvents();

        for (i = 0;  i < window_count;  i++)
        {
            if (glfwWindowShouldClose(windows[i]))
                break;
        }

        if (i < window_count)
            break;

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}